

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.cpp
# Opt level: O2

spv_result_t
spvOpcodeTableValueLookup
          (spv_target_env env,spv_opcode_table table,Op opcode,spv_opcode_desc *pEntry)

{
  uint uVar1;
  spv_opcode_desc psVar2;
  uint32_t uVar3;
  spv_result_t sVar4;
  spv_opcode_desc psVar5;
  ulong uVar6;
  ulong uVar7;
  
  if (table == (spv_opcode_table)0x0) {
    sVar4 = SPV_ERROR_INVALID_TABLE;
  }
  else if (pEntry == (spv_opcode_desc *)0x0) {
    sVar4 = SPV_ERROR_INVALID_POINTER;
  }
  else {
    psVar2 = table->entries;
    uVar1 = table->count;
    uVar3 = spvVersionForTargetEnv(env);
    psVar5 = psVar2;
    uVar7 = (ulong)uVar1;
    while (uVar6 = uVar7, 0 < (long)uVar6) {
      uVar7 = uVar6 >> 1;
      if (psVar5[uVar7].opcode < opcode) {
        psVar5 = psVar5 + uVar7 + 1;
        uVar7 = ~uVar7 + uVar6;
      }
    }
    while( true ) {
      if (psVar5 == psVar2 + uVar1) {
        return SPV_ERROR_INVALID_LOOKUP;
      }
      if (psVar5->opcode != opcode) {
        return SPV_ERROR_INVALID_LOOKUP;
      }
      if ((((psVar5->minVersion <= uVar3) && (uVar3 <= psVar5->lastVersion)) ||
          (psVar5->numExtensions != 0)) || (psVar5->numCapabilities != 0)) break;
      psVar5 = psVar5 + 1;
    }
    *pEntry = psVar5;
    sVar4 = SPV_SUCCESS;
  }
  return sVar4;
}

Assistant:

spv_result_t spvOpcodeTableValueLookup(spv_target_env env,
                                       const spv_opcode_table table,
                                       const spv::Op opcode,
                                       spv_opcode_desc* pEntry) {
  if (!table) return SPV_ERROR_INVALID_TABLE;
  if (!pEntry) return SPV_ERROR_INVALID_POINTER;

  const auto beg = table->entries;
  const auto end = table->entries + table->count;

  spv_opcode_desc_t needle = {"", opcode, 0,     nullptr, 0,       {},  0,
                              {}, false,  false, 0,       nullptr, ~0u, ~0u};

  auto comp = [](const spv_opcode_desc_t& lhs, const spv_opcode_desc_t& rhs) {
    return lhs.opcode < rhs.opcode;
  };

  // We need to loop here because there can exist multiple symbols for the same
  // opcode value, and they can be introduced in different target environments,
  // which means they can have different minimal version requirements.
  // Assumes the underlying table is already sorted ascendingly according to
  // opcode value.
  const auto version = spvVersionForTargetEnv(env);
  for (auto it = std::lower_bound(beg, end, needle, comp);
       it != end && it->opcode == opcode; ++it) {
    // We considers the current opcode as available as long as
    // 1. The target environment satisfies the minimal requirement of the
    //    opcode; or
    // 2. There is at least one extension enabling this opcode.
    //
    // Note that the second rule assumes the extension enabling this instruction
    // is indeed requested in the SPIR-V code; checking that should be
    // validator's work.
    if ((version >= it->minVersion && version <= it->lastVersion) ||
        it->numExtensions > 0u || it->numCapabilities > 0u) {
      *pEntry = it;
      return SPV_SUCCESS;
    }
  }

  return SPV_ERROR_INVALID_LOOKUP;
}